

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O2

bool __thiscall DyndepLoader::UpdateEdge(DyndepLoader *this,Edge *edge,Dyndeps *dyndeps,string *err)

{
  BindingEnv *this_00;
  Node *__rhs;
  pointer ppNVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  const_iterator i;
  pointer ppNVar4;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  if (dyndeps->restat_ == true) {
    this_00 = edge->env_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"restat",&local_69);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"1",&local_6a);
    BindingEnv::AddBinding(this_00,&local_68,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::vector<Node*,std::allocator<Node*>>::
  insert<__gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>,void>
            ((vector<Node*,std::allocator<Node*>> *)&edge->outputs_,
             (const_iterator)
             (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
             (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
             (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  ppNVar2 = (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppNVar3 = (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  edge->implicit_outs_ = edge->implicit_outs_ + (int)((ulong)((long)ppNVar3 - (long)ppNVar2) >> 3);
  do {
    if (ppNVar2 == ppNVar3) {
      std::vector<Node*,std::allocator<Node*>>::
      insert<__gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>,void>
                ((vector<Node*,std::allocator<Node*>> *)&edge->inputs_,
                 (const_iterator)
                 ((edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish + -(long)edge->order_only_deps_),
                 (__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
                 (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
                 (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      ppNVar4 = (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppNVar1 = (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      edge->implicit_deps_ =
           edge->implicit_deps_ + (int)((ulong)((long)ppNVar1 - (long)ppNVar4) >> 3);
      for (; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1) {
        Node::AddOutEdge(*ppNVar4,edge);
        ppNVar1 = (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
LAB_0010cad8:
      return ppNVar2 == ppNVar3;
    }
    __rhs = *ppNVar2;
    if (__rhs->in_edge_ != (Edge *)0x0) {
      std::operator+(&local_68,"multiple rules generate ",&__rhs->path_);
      std::__cxx11::string::operator=((string *)err,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      goto LAB_0010cad8;
    }
    __rhs->in_edge_ = edge;
    ppNVar2 = ppNVar2 + 1;
    ppNVar3 = (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

bool DyndepLoader::UpdateEdge(Edge* edge, Dyndeps const* dyndeps,
                              std::string* err) const {
  // Add dyndep-discovered bindings to the edge.
  // We know the edge already has its own binding
  // scope because it has a "dyndep" binding.
  if (dyndeps->restat_)
    edge->env_->AddBinding("restat", "1");

  // Add the dyndep-discovered outputs to the edge.
  edge->outputs_.insert(edge->outputs_.end(),
                        dyndeps->implicit_outputs_.begin(),
                        dyndeps->implicit_outputs_.end());
  edge->implicit_outs_ += dyndeps->implicit_outputs_.size();

  // Add this edge as incoming to each new output.
  for (std::vector<Node*>::const_iterator i =
           dyndeps->implicit_outputs_.begin();
       i != dyndeps->implicit_outputs_.end(); ++i) {
    if ((*i)->in_edge() != NULL) {
      *err = "multiple rules generate " + (*i)->path();
      return false;
    }
    (*i)->set_in_edge(edge);
  }

  // Add the dyndep-discovered inputs to the edge.
  edge->inputs_.insert(edge->inputs_.end() - edge->order_only_deps_,
                       dyndeps->implicit_inputs_.begin(),
                       dyndeps->implicit_inputs_.end());
  edge->implicit_deps_ += dyndeps->implicit_inputs_.size();

  // Add this edge as outgoing from each new input.
  for (std::vector<Node*>::const_iterator i =
           dyndeps->implicit_inputs_.begin();
       i != dyndeps->implicit_inputs_.end(); ++i)
    (*i)->AddOutEdge(edge);

  return true;
}